

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O3

void __thiscall
crypto_tests::CryptoTest::TestSHA3_256(CryptoTest *this,string *input,string *output)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  uint uVar5;
  SHA3_256 *pSVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  FastRandomContext *this_00;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  ulong uVar11;
  size_t sVar12;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  Span<const_unsigned_char> data;
  Span<unsigned_char> output_00;
  const_string file;
  Span<const_unsigned_char> data_00;
  Span<const_unsigned_char> data_01;
  Span<const_unsigned_char> data_02;
  Span<unsigned_char> output_01;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_bytes;
  uchar out [32];
  SHA3_256 sha;
  check_type cVar13;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  lazy_ostream local_1c0;
  undefined1 *local_1b0;
  char **local_1a8;
  assertion_result local_1a0;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  uchar local_138 [40];
  SHA3_256 local_110;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (input->_M_dataplus)._M_p;
  hex_str._M_len = input->_M_string_length;
  ParseHex<unsigned_char>(&local_150,hex_str);
  hex_str_00._M_str = (output->_M_dataplus)._M_p;
  hex_str_00._M_len = output->_M_string_length;
  ParseHex<unsigned_char>(&local_168,hex_str_00);
  local_110.m_bufsize = 0;
  local_110.m_pos = 0;
  memset(&local_110,0,200);
  data.m_size = (long)local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  data.m_data = local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  pSVar6 = SHA3_256::Write(&local_110,data);
  output_00.m_size = 0x20;
  output_00.m_data = local_138;
  SHA3_256::Finalize(pSVar6,output_00);
  if ((long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("out_bytes.size() == sizeof(out)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
                  ,0x44a,
                  "void crypto_tests::CryptoTest::TestSHA3_256(const std::string &, const std::string &)"
                 );
  }
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x44b;
  file.m_begin = (iterator)&local_178;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_188,msg);
  if ((long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
  }
  else {
    iVar4 = bcmp(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,local_138,
                 (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar4 == 0);
  }
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8 = &local_1d0;
  local_1d0 = "std::equal(std::begin(out_bytes), std::end(out_bytes), out)";
  local_1c8 = "";
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_1d8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_1c0,1,0,WARN,_cVar13,(size_t)&local_1e0,1099);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  SHA3_256::Reset(&local_110);
  uVar11 = (long)local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
  if (uVar11 == 0) {
    uVar5 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = (uint)lVar1 ^ 0x3f;
  }
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  do {
    uVar7 = RandomMixin<FastRandomContext>::randbits
                      (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar5);
  } while (uVar11 < uVar7);
  sVar12 = (size_t)(int)uVar7;
  uVar11 = (long)local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + sVar12);
  if (uVar11 == 0) {
    uVar5 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = (uint)lVar1 ^ 0x3f;
  }
  do {
    uVar8 = RandomMixin<FastRandomContext>::randbits
                      (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar5);
    puVar3 = local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  } while (uVar11 < uVar8);
  data_00.m_size = sVar12;
  data_00.m_data =
       local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  pSVar6 = SHA3_256::Write(&local_110,data_00);
  data_01.m_size = (size_t)(int)uVar8;
  data_01.m_data =
       local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + sVar12;
  SHA3_256::Write(pSVar6,data_01);
  data_02.m_size = (size_t)((int)puVar3 - ((int)uVar8 + (int)uVar7 + (int)puVar2));
  data_02.m_data =
       local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish + -data_02.m_size;
  pSVar6 = SHA3_256::Write(&local_110,data_02);
  output_01.m_size = 0x20;
  output_01.m_data = local_138;
  SHA3_256::Finalize(pSVar6,output_01);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x454;
  file_00.m_begin = (iterator)&local_1f0;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_200,
             msg_00);
  if ((long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
  }
  else {
    iVar4 = bcmp(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,local_138,
                 (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar4 == 0);
  }
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d0 = "std::equal(std::begin(out_bytes), std::end(out_bytes), out)";
  local_1c8 = "";
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_1d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_1c0,1,0,WARN,0xe75ce0,(size_t)&stack0xfffffffffffffdf0,0x454);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CryptoTest::TestSHA3_256(const std::string& input, const std::string& output)
{
    const auto in_bytes = ParseHex(input);
    const auto out_bytes = ParseHex(output);

    SHA3_256 sha;
    // Hash the whole thing.
    unsigned char out[SHA3_256::OUTPUT_SIZE];
    sha.Write(in_bytes).Finalize(out);
    assert(out_bytes.size() == sizeof(out));
    BOOST_CHECK(std::equal(std::begin(out_bytes), std::end(out_bytes), out));

    // Reset and split randomly in 3
    sha.Reset();
    int s1 = m_rng.randrange(in_bytes.size() + 1);
    int s2 = m_rng.randrange(in_bytes.size() + 1 - s1);
    int s3 = in_bytes.size() - s1 - s2;
    sha.Write(Span{in_bytes}.first(s1)).Write(Span{in_bytes}.subspan(s1, s2));
    sha.Write(Span{in_bytes}.last(s3)).Finalize(out);
    BOOST_CHECK(std::equal(std::begin(out_bytes), std::end(out_bytes), out));
}